

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::buildReads(Automaton *this)

{
  bool bVar1;
  pointer pNVar2;
  _Rb_tree_const_iterator<Node<Read>_> *in_RDI;
  long in_FS_OFFSET;
  Automaton *in_stack_00000010;
  iterator node_1;
  iterator node;
  ReadNode in_stack_00000048;
  _Rb_tree_const_iterator<Node<Read>_> *this_00;
  Automaton *in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd0;
  _Self local_28;
  _Base_ptr local_20;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  buildDirectReads(in_stack_ffffffffffffffc8);
  buildReadsDigraph((Automaton *)in_stack_ffffffffffffffd0._M_node);
  *(undefined4 *)&in_RDI[0x10]._M_node = 0;
  local_10._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_10._M_node = (_Base_ptr)Node<Read>::begin_nodes();
  while( true ) {
    local_18._M_node = (_Base_ptr)Node<Read>::end_nodes();
    bVar1 = std::operator!=(&local_10,&local_18);
    if (!bVar1) break;
    pNVar2 = std::_Rb_tree_const_iterator<Node<Read>_>::operator->
                       ((_Rb_tree_const_iterator<Node<Read>_> *)0x11fe8f);
    if ((pNVar2->root & 1U) != 0) {
      local_20 = local_10._M_node;
      visitReadNode(in_stack_00000010,in_stack_00000048);
    }
    std::_Rb_tree_const_iterator<Node<Read>_>::operator++(this_00);
  }
  local_28._M_node = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  local_28._M_node = (_Base_ptr)Node<Read>::begin_nodes();
  while( true ) {
    Node<Read>::end_nodes();
    bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    visitReadNode(in_stack_00000010,in_stack_00000048);
    std::_Rb_tree_const_iterator<Node<Read>_>::operator++(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Automaton::buildReads ()
{
  buildDirectReads ();
  buildReadsDigraph ();

  _M_reads_dfn = 0;

  for (ReadsGraph::iterator node = ReadsGraph::begin_nodes (); node != ReadsGraph::end_nodes (); ++node)
    {
      if (! node->root)
        continue;

      visitReadNode (node);
    }

  for (ReadsGraph::iterator node = ReadsGraph::begin_nodes (); node != ReadsGraph::end_nodes (); ++node)
    visitReadNode (node);
}